

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O1

int __thiscall PFData::writeFile(PFData *this,string *filename)

{
  pointer pcVar1;
  int iVar2;
  vector<long,_std::allocator<long>_> _offsets;
  allocator_type local_51;
  vector<long,_std::allocator<long>_> local_50;
  string local_38;
  
  std::vector<long,_std::allocator<long>_>::vector
            (&local_50,(long)this->m_r * (long)this->m_q * (long)this->m_p + 1,&local_51);
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + filename->_M_string_length);
  iVar2 = writeFile(this,&local_38,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar2;
}

Assistant:

int PFData::writeFile(const std::string filename) {
    std::vector<long> _offsets((m_p*m_q*m_r) + 1);
    return writeFile(filename, _offsets);
}